

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_content<httplib::Request>(Stream *strm,Request *x,Progress *progress)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  string *out;
  function<void_(unsigned_long,_unsigned_long)> local_50;
  
  iVar2 = get_header_value_int(&x->headers,"Content-Length",0);
  if (iVar2 != 0) {
    std::function<void_(unsigned_long,_unsigned_long)>::function(&local_50,progress);
    bVar1 = read_content_with_length(strm,&x->body,(long)iVar2,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    return bVar1;
  }
  __s1 = get_header_value(&x->headers,"Transfer-Encoding","");
  iVar2 = strcasecmp(__s1,"chunked");
  if (iVar2 != 0) {
    bVar1 = read_content_without_length(strm,&x->body);
    return bVar1;
  }
  bVar1 = read_content_chunked((detail *)strm,(Stream *)&x->body,out);
  return bVar1;
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    auto len = get_header_value_int(x.headers, "Content-Length", 0);

    if (len) {
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", "");

        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        } else {
            return read_content_without_length(strm, x.body);
        }
    }

    return true;
}